

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O1

void __thiscall Ray::Ray(Ray *this,vec3 *o,vec3 *d,float near,float far)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  *(undefined8 *)((long)&(this->dir).field_0 + 4) = 0;
  *(undefined8 *)&(this->invdir).field_0 = 0;
  *(undefined8 *)&(this->origin).field_0 = 0;
  *(undefined8 *)((long)&(this->origin).field_0 + 8) = 0;
  (this->invdir).field_0.field_0.z = 0.0;
  (this->origin).field_0.field_0.x = (o->field_0).field_0.x;
  (this->origin).field_0.field_0.y = (o->field_0).field_0.y;
  (this->origin).field_0.field_0.z = (o->field_0).field_0.z;
  fVar1 = (d->field_0).field_0.x;
  fVar2 = (d->field_0).field_0.y;
  fVar3 = (d->field_0).field_0.z;
  fVar1 = fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
  if (0.0 < fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = 1.0 / fVar1;
    fVar2 = (d->field_0).field_0.x * fVar1;
    fVar3 = (d->field_0).field_0.y * fVar1;
    fVar1 = fVar1 * (d->field_0).field_0.z;
    (this->dir).field_0.field_0.x = fVar2;
    (this->dir).field_0.field_0.y = fVar3;
    (this->dir).field_0.field_0.z = fVar1;
    this->tMin = near;
    this->tMax = far;
    fVar2 = 1.0 / fVar2;
    (this->invdir).field_0.field_0.x = fVar2;
    fVar3 = 1.0 / fVar3;
    (this->invdir).field_0.field_0.y = fVar3;
    fVar1 = 1.0 / fVar1;
    (this->invdir).field_0.field_0.z = fVar1;
    this->sign[0] = fVar2 < 0.0;
    this->sign[1] = fVar3 < 0.0;
    this->sign[2] = fVar1 < 0.0;
    return;
  }
  __assert_fail("x > genType(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/J-Zeitler[P]AGIR-Raytracer/lib/glm/glm/./core/func_exponential.inl"
                ,0x95,"genType glm::inversesqrt(const genType &) [genType = float]");
}

Assistant:

Ray::Ray(glm::vec3 o, glm::vec3 d, float near, float far) {
    origin = o; dir = glm::normalize(d); tMin = near; tMax = far;
    invdir.x = 1 / dir.x;
    invdir.y = 1 / dir.y;
    invdir.z = 1 / dir.z;
    sign[0] = (invdir.x < 0);
    sign[1] = (invdir.y < 0);
    sign[2] = (invdir.z < 0);
}